

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O1

void __thiscall
libtorrent::incoming_connection_alert::~incoming_connection_alert(incoming_connection_alert *this)

{
  operator_delete(this,0x30);
  return;
}

Assistant:

struct TORRENT_EXPORT incoming_connection_alert final : alert
	{
		// internal
		TORRENT_UNEXPORT incoming_connection_alert(aux::stack_allocator& alloc
			, socket_type_t t, tcp::endpoint const& i);

		TORRENT_DEFINE_ALERT(incoming_connection_alert, 66)

		static inline constexpr alert_category_t static_category = alert_category::peer;
		std::string message() const override;

		// tells you what kind of socket the connection was accepted
		socket_type_t socket_type;

		// is the IP address and port the connection came from.
		aux::noexcept_movable<tcp::endpoint> endpoint;

#if TORRENT_ABI_VERSION == 1
		// is the IP address and port the connection came from.
		TORRENT_DEPRECATED aux::noexcept_movable<tcp::endpoint> ip;
#endif
	}